

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::IAsyncTask> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IAsyncTask>::operator=
          (RefCntAutoPtr<Diligent::IAsyncTask> *this,RefCntAutoPtr<Diligent::IAsyncTask> *AutoPtr)

{
  IAsyncTask *pObj;
  RefCntAutoPtr<Diligent::IAsyncTask> *AutoPtr_local;
  RefCntAutoPtr<Diligent::IAsyncTask> *this_local;
  
  if (this->m_pObject != AutoPtr->m_pObject) {
    pObj = Detach(AutoPtr);
    Attach(this,pObj);
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }